

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::UnsupportedImageSource::~UnsupportedImageSource(UnsupportedImageSource *this)

{
  UnsupportedImageSource *this_local;
  
  ~UnsupportedImageSource(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

UnsupportedImageSource	(const string& message, GLenum format) : m_message(message), m_format(format) {}